

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void closegoto(LexState *ls,int g,Labeldesc *label)

{
  Dyndata *pDVar1;
  int iVar2;
  undefined7 uVar3;
  Labellist *pLVar4;
  Labeldesc *pLVar5;
  LocVar *pLVar6;
  char *msg_00;
  Labeldesc *pLVar7;
  char *msg;
  TString *vname;
  Labeldesc *gt;
  Labellist *gl;
  FuncState *fs;
  int i;
  Labeldesc *label_local;
  int g_local;
  LexState *ls_local;
  
  pDVar1 = ls->dyd;
  pLVar4 = &pDVar1->gt;
  pLVar5 = pLVar4->arr + g;
  if (pLVar5->nactvar < label->nactvar) {
    pLVar6 = getlocvar(ls->fs,(uint)pLVar5->nactvar);
    msg_00 = luaO_pushfstring(ls->L,"<goto %s> at line %d jumps into the scope of local \'%s\'",
                              pLVar5->name + 1,(ulong)(uint)pLVar5->line,pLVar6->varname + 1);
    semerror(ls,msg_00);
  }
  luaK_patchlist(ls->fs,pLVar5->pc,label->pc);
  for (fs._4_4_ = g; fs._4_4_ < (pDVar1->gt).n + -1; fs._4_4_ = fs._4_4_ + 1) {
    pLVar5 = pLVar4->arr + fs._4_4_;
    pLVar7 = pLVar4->arr + (fs._4_4_ + 1);
    pLVar5->name = pLVar7->name;
    iVar2 = pLVar7->line;
    pLVar5->pc = pLVar7->pc;
    pLVar5->line = iVar2;
    uVar3 = *(undefined7 *)&pLVar7->field_0x11;
    pLVar5->nactvar = pLVar7->nactvar;
    *(undefined7 *)&pLVar5->field_0x11 = uVar3;
  }
  (pDVar1->gt).n = (pDVar1->gt).n + -1;
  return;
}

Assistant:

static void closegoto (LexState *ls, int g, Labeldesc *label) {
  int i;
  FuncState *fs = ls->fs;
  Labellist *gl = &ls->dyd->gt;
  Labeldesc *gt = &gl->arr[g];
  lua_assert(luaS_eqstr(gt->name, label->name));
  if (gt->nactvar < label->nactvar) {
    TString *vname = getlocvar(fs, gt->nactvar)->varname;
    const char *msg = luaO_pushfstring(ls->L,
      "<goto %s> at line %d jumps into the scope of local " LUA_QS,
      getstr(gt->name), gt->line, getstr(vname));
    semerror(ls, msg);
  }
  luaK_patchlist(fs, gt->pc, label->pc);
  /* remove goto from pending list */
  for (i = g; i < gl->n - 1; i++)
    gl->arr[i] = gl->arr[i + 1];
  gl->n--;
}